

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_dimstyle.cpp
# Opt level: O2

void __thiscall ON_DimStyleExtra::SetDefaults(ON_DimStyleExtra *this)

{
  int iVar1;
  bool *pbVar2;
  anon_union_4_2_6147a14e_for_ON_Color_15 aVar3;
  int i;
  long lVar4;
  
  this->m_tolerance_style = 0;
  this->m_tolerance_resolution = 4;
  this->m_tolerance_upper_value = 0.0;
  this->m_tolerance_lower_value = 0.0;
  this->m_tolerance_height_scale = 1.0;
  this->m_baseline_spacing = 1.0;
  this->m_bDrawMask = false;
  this->m_mask_color_source = 0;
  aVar3 = (anon_union_4_2_6147a14e_for_ON_Color_15)ON_V5x_DimStyle::DefaultMaskColor();
  (this->m_mask_color).field_0 = aVar3;
  this->m_dimscale = 1.0;
  this->m_dimscale_source = 0;
  iVar1 = (this->m_valid_fields).m_count;
  pbVar2 = (this->m_valid_fields).m_a;
  for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    pbVar2[lVar4] = false;
  }
  return;
}

Assistant:

void ON_DimStyleExtra::SetDefaults()
{
  m_tolerance_style = ON_V5x_DimStyle::DefaultToleranceStyle();
  m_tolerance_resolution = ON_V5x_DimStyle::DefaultToleranceResolution();
  m_tolerance_upper_value = ON_V5x_DimStyle::DefaultToleranceUpperValue();
  m_tolerance_lower_value = ON_V5x_DimStyle::DefaultToleranceLowerValue();
  m_tolerance_height_scale = ON_V5x_DimStyle::DefaultToleranceHeightScale();
  m_baseline_spacing = ON_V5x_DimStyle::DefaultBaselineSpacing();
  m_bDrawMask = ON_V5x_DimStyle::DefaultDrawTextMask(); // false;
  m_mask_color_source = ON_V5x_DimStyle::DefaultMaskColorSource(); // 0;
  m_mask_color = ON_V5x_DimStyle::DefaultMaskColor(); // .SetRGB(255,255,255);
  m_dimscale = ON_V5x_DimStyle::DefaultDimScale(); // 1.0;
  m_dimscale_source = ON_V5x_DimStyle::DefaultDimScaleSource(); // 0;

  for( int i = 0; i < m_valid_fields.Count(); i++)
    m_valid_fields[i] = false;
}